

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O0

void __thiscall OptionRecordString::~OptionRecordString(OptionRecordString *this)

{
  OptionRecordString *in_RDI;
  
  ~OptionRecordString(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~OptionRecordString() {}